

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::detail::
build_param_type_list<void,henson::NameMap*,std::__cxx11::string,double>
          (_func_void_NameMap_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_double
           *param_1)

{
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_RDI;
  allocator_type *in_stack_ffffffffffffff78;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffff80;
  initializer_list<chaiscript::Type_Info> in_stack_ffffffffffffff88;
  
  user_type<void>();
  user_type<henson::NameMap*>();
  user_type<std::__cxx11::string>();
  user_type<double>();
  std::allocator<chaiscript::Type_Info>::allocator((allocator<chaiscript::Type_Info> *)0x3070ab);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff78);
  std::allocator<chaiscript::Type_Info>::~allocator((allocator<chaiscript::Type_Info> *)0x3070d6);
  return in_RDI;
}

Assistant:

std::vector<Type_Info> build_param_type_list(Ret (*)(Params...))
        {
          /// \note somehow this is responsible for a large part of the code generation
          return { user_type<Ret>(), user_type<Params>()... };
        }